

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QByteArray * __thiscall
QAuthenticatorPrivate::digestMd5Response
          (QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *this,QByteArrayView challenge,
          QByteArrayView method,QByteArrayView path)

{
  storage_type *psVar1;
  QArrayData *pQVar2;
  storage_type *psVar3;
  Data *pDVar4;
  storage_type *psVar5;
  QArrayData *pQVar6;
  qsizetype qVar7;
  char *pcVar8;
  qsizetype qVar9;
  qsizetype qVar10;
  storage_type *psVar11;
  Data *pDVar12;
  qsizetype qVar13;
  char (*pacVar14) [11];
  int iVar15;
  long in_FS_OFFSET;
  QByteArrayView challenge_00;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QHash<QByteArray,_QByteArray> options;
  QCryptographicHash hash;
  QArrayData *local_1c0 [2];
  storage_type *local_1b0;
  QArrayData *local_1a8 [2];
  storage_type *local_198;
  QArrayData *local_190 [2];
  storage_type *local_180;
  QByteArray local_178;
  QByteArray local_160;
  QArrayData *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  QByteArray local_128;
  QByteArray local_108;
  QByteArray local_e8;
  QByteArrayView local_c8;
  storage_type *local_b8;
  QHash<QByteArray,_QByteArray> local_a8;
  QByteArray local_a0;
  QByteArray local_88;
  undefined1 *local_70;
  QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[4]> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  challenge_00.m_data = (storage_type *)challenge.m_size;
  challenge_00.m_size = (qsizetype)&local_a8;
  parseDigestAuthenticationChallenge(challenge_00);
  iVar15 = this->nonceCount + 1;
  this->nonceCount = iVar15;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.m_data = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::number((int)&local_c8,iVar15);
  if (local_b8 < (storage_type *)0x8) {
    do {
      local_68.a.a = (char (*) [11])CONCAT71(local_68.a.a._1_7_,0x30);
      QByteArray::insert((longlong)&local_c8,(QByteArrayView)(ZEXT816(1) << 0x40));
    } while (local_b8 < (storage_type *)0x8);
  }
  local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_68,"nonce",-1);
  QHash<QByteArray,_QByteArray>::value(&local_e8,&local_a8,(QByteArray *)&local_68);
  if ((QArrayData *)local_68.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a,1,0x10);
    }
  }
  local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_68,"opaque",-1);
  QHash<QByteArray,_QByteArray>::value(&local_108,&local_a8,(QByteArray *)&local_68);
  if ((QArrayData *)local_68.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a,1,0x10);
    }
  }
  local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_128.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_68,"qop",-1);
  QHash<QByteArray,_QByteArray>::value(&local_128,&local_a8,(QByteArray *)&local_68);
  if ((QArrayData *)local_68.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a,1,0x10);
    }
  }
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  local_148 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_178,"algorithm",-1);
  QHash<QByteArray,_QByteArray>::value(&local_160,&local_a8,&local_178);
  QString::toLatin1_helper((QString *)local_190);
  QString::toLatin1_helper((QString *)local_1a8);
  QString::toLatin1_helper((QString *)local_1c0);
  psVar11 = local_b8;
  qVar10 = local_e8.d.size;
  qVar9 = local_128.d.size;
  pcVar8 = local_128.d.ptr;
  qVar7 = path.m_size;
  psVar1 = (storage_type *)(this->cnonce).d.size;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::QCryptographicHash((QCryptographicHash *)&local_70,Md5);
  QVar16.m_data = local_180;
  QVar16.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar16);
  QVar17.m_data = (storage_type *)0x1;
  QVar17.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar17);
  QVar18.m_data = local_198;
  QVar18.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar18);
  QVar19.m_data = (storage_type *)0x1;
  QVar19.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar19);
  QVar20.m_data = local_1b0;
  QVar20.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar20);
  local_68.a.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_68.a.a = (char (*) [11])&DAT_aaaaaaaaaaaaaaaa;
  local_68.a.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::result();
  iVar15 = qstrnicmp(local_160.d.ptr,local_160.d.size,"md5-sess",8);
  if (iVar15 == 0) {
    QCryptographicHash::reset();
    QByteArray::toHex((char)&local_88);
    QVar37.m_data = (storage_type *)local_88.d.size;
    QVar37.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar37);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
    QVar38.m_data = (storage_type *)0x1;
    QVar38.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar38);
    QVar39.m_data = (storage_type *)qVar10;
    QVar39.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar39);
    QVar40.m_data = (storage_type *)0x1;
    QVar40.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar40);
    QVar41.m_data = psVar1;
    QVar41.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar41);
    QCryptographicHash::result();
    pDVar4 = local_68.a.b.d.d;
    pacVar14 = local_68.a.a;
    qVar13 = local_88.d.size;
    pDVar12 = local_88.d.d;
    pQVar2 = (QArrayData *)local_68.a.a;
    psVar5 = local_68.a.b.d.ptr;
    pQVar6 = &(local_88.d.d)->super_QArrayData;
    local_68.a.b.d.d = (Data *)local_88.d.ptr;
    local_88.d.d = (Data *)local_68.a.a;
    local_68.a.a = (char (*) [11])pDVar12;
    psVar3 = (storage_type *)local_88.d.size;
    local_88.d.ptr = (char *)pDVar4;
    local_88.d.size = (qsizetype)local_68.a.b.d.ptr;
    local_68.a.b.d.ptr = (char *)qVar13;
    if ((QArrayData *)pacVar14 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*pacVar14)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*pacVar14)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*pacVar14)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)pacVar14,1,0x10);
      }
    }
  }
  QByteArray::toHex((char)&local_88);
  pDVar12 = local_68.a.b.d.d;
  pacVar14 = local_68.a.a;
  qVar13 = local_88.d.size;
  pDVar4 = local_88.d.d;
  local_88.d.d = (Data *)local_68.a.a;
  local_68.a.a = (char (*) [11])pDVar4;
  local_68.a.b.d.d = (Data *)local_88.d.ptr;
  local_88.d.ptr = (char *)pDVar12;
  local_88.d.size = (qsizetype)local_68.a.b.d.ptr;
  local_68.a.b.d.ptr = (char *)qVar13;
  if ((QArrayData *)pacVar14 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*pacVar14)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*pacVar14)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*pacVar14)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pacVar14,1,0x10);
    }
  }
  QCryptographicHash::reset();
  QVar21.m_data = (storage_type *)method.m_size;
  QVar21.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar21);
  QVar22.m_data = (storage_type *)0x1;
  QVar22.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar22);
  QVar23.m_data = (storage_type *)qVar7;
  QVar23.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar23);
  iVar15 = qstrnicmp(pcVar8,qVar9,"auth-int",8);
  if (iVar15 == 0) {
    QVar24.m_data = (storage_type *)0x1;
    QVar24.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar24);
    QVar25.m_data = (storage_type *)0x0;
    QVar25.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar25);
  }
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::result();
  QByteArray::toHex((char)&local_88);
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,1,0x10);
    }
  }
  QCryptographicHash::reset();
  QVar26.m_data = local_68.a.b.d.ptr;
  QVar26.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar26);
  QVar27.m_data = (storage_type *)0x1;
  QVar27.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar27);
  QVar28.m_data = (storage_type *)qVar10;
  QVar28.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar28);
  QVar29.m_data = (storage_type *)0x1;
  QVar29.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar29);
  if (pcVar8 != (char *)0x0) {
    QVar30.m_data = psVar11;
    QVar30.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar30);
    QVar31.m_data = (storage_type *)0x1;
    QVar31.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar31);
    QVar32.m_data = psVar1;
    QVar32.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar32);
    QVar33.m_data = (storage_type *)0x1;
    QVar33.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar33);
    QVar34.m_data = (storage_type *)qVar9;
    QVar34.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar34);
    QVar35.m_data = (storage_type *)0x1;
    QVar35.m_size = (qsizetype)&local_70;
    QCryptographicHash::addData(QVar35);
  }
  QVar36.m_data = (storage_type *)local_88.d.size;
  QVar36.m_size = (qsizetype)&local_70;
  QCryptographicHash::addData(QVar36);
  QCryptographicHash::result();
  QByteArray::toHex((char)(QArrayData *)&local_148);
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((QArrayData *)local_68.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a,1,0x10);
    }
  }
  QCryptographicHash::~QCryptographicHash((QCryptographicHash *)&local_70);
  if (local_1c0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_1c0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1c0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1c0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1c0[0],1,0x10);
    }
  }
  if (local_1a8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_1a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1a8[0],1,0x10);
    }
  }
  if (local_190[0] != (QArrayData *)0x0) {
    LOCK();
    (local_190[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_190[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_190[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_190[0],1,0x10);
    }
  }
  if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,1,0x10);
    }
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  QString::toLatin1_helper((QString *)&local_88);
  local_68.a.b.d.size = local_88.d.size;
  local_68.a.b.d.ptr = local_88.d.ptr;
  local_68.a.b.d.d = local_88.d.d;
  local_88.d.size = 0;
  local_68.a.a = (char (*) [11])0x25db80;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char *)0x0;
  local_68.b = (char (*) [4])0x25db8b;
  QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[11],QByteArray>,char_const(&)[4]>
            (__return_storage_ptr__,&local_68,'\0');
  if (&(local_68.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.b.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  QString::toLatin1_helper((QString *)&local_88);
  local_68.a.b.d.size = local_88.d.size;
  local_68.a.b.d.ptr = local_88.d.ptr;
  local_68.a.b.d.d = local_88.d.d;
  local_88.d.size = 0;
  local_68.a.a = (char (*) [11])0x25db8f;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char *)0x0;
  local_68.b = (char (*) [4])0x25db8b;
  QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[8],QByteArray>,char_const(&)[4]>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray>,_const_char_(&)[4]> *)
             &local_68,'\0');
  if (&(local_68.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.b.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_68.a.a = (char (*) [11])0x25dbc6;
  local_68.a.b.d.d = (Data *)&local_e8;
  local_68.a.b.d.ptr = "\", ";
  QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[8],QByteArray&>,char_const(&)[4]>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray_&>,_const_char_(&)[4]> *)
             &local_68,'\0');
  local_68.a.a = (char (*) [11])0x25db97;
  local_68.a.b.d.d = (Data *)&path;
  local_68.a.b.d.ptr = "\", ";
  QtStringBuilder::
  appendToByteArray<QStringBuilder<char_const(&)[6],QByteArrayView&>,char_const(&)[4]>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<const_char_(&)[6],_QByteArrayView_&>,_const_char_(&)[4]>
              *)&local_68,'\0');
  if ((undefined1 *)local_108.d.size != (undefined1 *)0x0) {
    local_68.a.a = (char (*) [11])0x25db9d;
    local_68.a.b.d.d = (Data *)&local_108;
    local_68.a.b.d.ptr = "\", ";
    QtStringBuilder::
    appendToByteArray<QStringBuilder<char_const(&)[9],QByteArray&>,char_const(&)[4]>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_const_char_(&)[4]> *
               )&local_68,'\0');
  }
  local_68.a.a = &anon_var_dwarf_326e08;
  local_68.a.b.d.ptr = (char *)CONCAT71(local_68.a.b.d.ptr._1_7_,0x22);
  local_68.a.b.d.d = (Data *)&local_148;
  QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[11],QByteArray&>,char>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray_&>,_char> *)&local_68,
             '\0');
  QByteArray::QByteArray(&local_88,"algorithm",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_68,&local_a8,&local_88);
  pcVar8 = local_68.a.b.d.ptr;
  if ((QArrayData *)local_68.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (pcVar8 != (char *)0x0) {
    QByteArray::QByteArray(&local_a0,"algorithm",-1);
    QHash<QByteArray,_QByteArray>::value(&local_88,&local_a8,&local_a0);
    local_68.a.b.d.size = local_88.d.size;
    local_68.a.b.d.ptr = local_88.d.ptr;
    local_68.a.b.d.d = local_88.d.d;
    local_68.a.a = (char (*) [11])anon_var_dwarf_326e14;
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char *)0x0;
    local_88.d.size = 0;
    QtStringBuilder::appendToByteArray<char_const(&)[13],QByteArray>
              (__return_storage_ptr__,(QStringBuilder<const_char_(&)[13],_QByteArray> *)&local_68,
               '\0');
    if (&(local_68.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.b.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QByteArray::QByteArray(&local_88,"qop",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_68,&local_a8,&local_88);
  pcVar8 = local_68.a.b.d.ptr;
  if ((QArrayData *)local_68.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_68.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (pcVar8 != (char *)0x0) {
    local_68.a.a = (char (*) [11])0x25dbbe;
    local_68.a.b.d.d = (Data *)&local_128;
    local_68.a.b.d.ptr = ", ";
    QtStringBuilder::
    appendToByteArray<QStringBuilder<char_const(&)[7],QByteArray&>,char_const(&)[3]>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[7],_QByteArray_&>,_const_char_(&)[3]> *
               )&local_68,'\0');
    local_68.a.a = (char (*) [11])0x263da8;
    local_68.a.b.d.d = (Data *)&local_c8;
    local_68.a.b.d.ptr = ", ";
    QtStringBuilder::
    appendToByteArray<QStringBuilder<char_const(&)[4],QByteArray&>,char_const(&)[3]>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[4],_QByteArray_&>,_const_char_(&)[3]> *
               )&local_68,'\0');
    local_68.a.a = (char (*) [11])0x25dbc5;
    local_68.a.b.d.ptr = (char *)CONCAT71(local_68.a.b.d.ptr._1_7_,0x22);
    local_68.a.b.d.d = (Data *)&this->cnonce;
    QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[9],QByteArray&>,char>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_char> *)&local_68,
               '\0');
  }
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148,1,0x10);
    }
  }
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((QArrayData *)local_c8.m_size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.m_size,1,0x10);
    }
  }
  QHash<QByteArray,_QByteArray>::~QHash(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QAuthenticatorPrivate::digestMd5Response(QByteArrayView challenge, QByteArrayView method,
                                                    QByteArrayView path)
{
    QHash<QByteArray,QByteArray> options = parseDigestAuthenticationChallenge(challenge);

    ++nonceCount;
    QByteArray nonceCountString = QByteArray::number(nonceCount, 16);
    while (nonceCountString.size() < 8)
        nonceCountString.prepend('0');

    QByteArray nonce = options.value("nonce");
    QByteArray opaque = options.value("opaque");
    QByteArray qop = options.value("qop");

//    qDebug() << "calculating digest: method=" << method << "path=" << path;
    QByteArray response = digestMd5ResponseHelper(options.value("algorithm"), user.toLatin1(),
                                              realm.toLatin1(), password.toLatin1(),
                                              nonce, nonceCountString,
                                              cnonce, qop, method,
                                              path, QByteArray());


    QByteArray credentials;
    credentials += "username=\"" + user.toLatin1() + "\", ";
    credentials += "realm=\"" + realm.toLatin1() + "\", ";
    credentials += "nonce=\"" + nonce + "\", ";
    credentials += "uri=\"" + path + "\", ";
    if (!opaque.isEmpty())
        credentials += "opaque=\"" + opaque + "\", ";
    credentials += "response=\"" + response + '"';
    if (!options.value("algorithm").isEmpty())
        credentials += ", algorithm=" + options.value("algorithm");
    if (!options.value("qop").isEmpty()) {
        credentials += ", qop=" + qop + ", ";
        credentials += "nc=" + nonceCountString + ", ";
        credentials += "cnonce=\"" + cnonce + '"';
    }

    return credentials;
}